

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O3

int writeMPS_sparse(char *filename,int *numRow,int *numCol,int *objSense,double *objOffset,
                   vector<int,_std::allocator<int>_> *Astart,
                   vector<int,_std::allocator<int>_> *Aindex,
                   vector<double,_std::allocator<double>_> *Avalue,
                   vector<double,_std::allocator<double>_> *rhs,
                   vector<double,_std::allocator<double>_> *cost,
                   vector<double,_std::allocator<double>_> *lb,
                   vector<double,_std::allocator<double>_> *ub,
                   vector<int,_std::allocator<int>_> *integerColumn)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  int iVar5;
  long lVar6;
  vector<double,_std::allocator<double>_> colLower;
  vector<double,_std::allocator<double>_> colCost;
  vector<double,_std::allocator<double>_> rowUpper;
  vector<double,_std::allocator<double>_> rowLower;
  vector<double,_std::allocator<double>_> colUpper;
  
  colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  printf("writeMPS_sparse: Model has %d rows, %d columns and  nonzeros\n",(ulong)(uint)*numRow,
         (ulong)(uint)*numCol);
  std::ostream::flush();
  std::vector<double,_std::allocator<double>_>::resize(&colCost,(long)*numCol);
  std::vector<double,_std::allocator<double>_>::resize(&colLower,(long)*numCol);
  std::vector<double,_std::allocator<double>_>::resize(&colUpper,(long)*numCol);
  std::vector<double,_std::allocator<double>_>::resize(&rowLower,(long)*numRow);
  std::vector<double,_std::allocator<double>_>::resize(&rowUpper,(long)*numRow);
  iVar5 = *numCol;
  if (0 < (long)iVar5) {
    pdVar2 = (cost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (lb->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (ub->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6] = pdVar2[lVar6];
      colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6] = pdVar3[lVar6];
      colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6] = pdVar4[lVar6];
      lVar6 = lVar6 + 1;
    } while (iVar5 != lVar6);
  }
  iVar5 = *numRow;
  if (0 < (long)iVar5) {
    pdVar2 = (rhs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      dVar1 = pdVar2[lVar6];
      rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6] = dVar1;
      rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6] = dVar1;
      lVar6 = lVar6 + 1;
    } while (iVar5 != lVar6);
  }
  iVar5 = writeMPS(filename,numRow,numCol,(int *)Avalue,(double *)&colCost,Astart,Aindex,Avalue,
                   &colCost,&colLower,&colUpper,&rowLower,&rowUpper,integerColumn);
  if (rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(rowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(rowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(colUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(colLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar5;
}

Assistant:

int writeMPS_sparse(const char *filename, int& numRow, int& numCol, int& objSense, double& objOffset,
		    vector<int>& Astart, vector<int>& Aindex, vector<double>& Avalue,
		    vector<double>& rhs, vector<double>& cost, vector<double>& lb, vector<double>& ub,
		    vector<int>& integerColumn) {
  vector<double> colCost;
  vector<double> colLower;
  vector<double> colUpper;
  vector<double> rowLower;
  vector<double> rowUpper;

#ifdef JAJH_dev
  printf("writeMPS_sparse: Model has %d rows, %d columns and  nonzeros\n", numRow, numCol);//, Astart[numCol]);
  cout<<flush;
#endif
  colCost.resize(numCol);
  colLower.resize(numCol);
  colUpper.resize(numCol);
  rowLower.resize(numRow);
  rowUpper.resize(numRow);

  for (int c_n = 0; c_n<numCol; c_n++) {
    colCost[c_n] = cost[c_n];
    colLower[c_n] = lb[c_n];
    colUpper[c_n] = ub[c_n];
  }
  for (int r_n = 0; r_n<numRow; r_n++) {
    rowLower[r_n] = rhs[r_n];
    rowUpper[r_n] = rhs[r_n];
  }  
  int rtCd = writeMPS(filename, numRow, numCol, objSense, objOffset,
		      Astart,  Aindex, Avalue,
		      colCost, colLower, colUpper,
		      rowLower, rowUpper,
		      integerColumn);
  return rtCd;
}